

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O1

void __thiscall RegressionTree::genDynamicFunctions(RegressionTree *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Function *this_00;
  Attribute *pAVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  ulong *puVar8;
  size_type *psVar9;
  long *plVar10;
  _Ios_Openmode _Var11;
  ulong uVar12;
  size_t sVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string functionSource;
  string functionHeaders;
  ofstream ofs;
  string local_458;
  ulong *local_438;
  long local_430;
  ulong local_428;
  long lStack_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8;
  long lStack_3c0;
  undefined8 *local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong *local_398;
  long local_390;
  ulong local_388;
  long lStack_380;
  ulong *local_378;
  long local_370;
  ulong local_368 [2];
  ulong *local_358;
  long local_350;
  ulong local_348 [2];
  ulong *local_338;
  long local_330;
  ulong local_328 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  char *local_278;
  long local_270;
  char local_268 [16];
  size_t local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230;
  filebuf local_228 [8];
  undefined1 local_220 [232];
  ios_base local_138 [264];
  
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"","");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"","");
  paVar2 = &local_458.field_2;
  sVar13 = 0;
  do {
    bVar3 = std::bitset<1500UL>::test
                      ((this->_candidateMask).
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 100,sVar13);
    if (bVar3) {
      this_00 = QueryCompiler::getFunction
                          ((this->_compiler).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           sVar13);
      local_230 = local_220;
      local_258 = sVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
      sVar13 = 0;
      do {
        bVar3 = std::bitset<100UL>::test(&this_00->_fVars,sVar13);
        if (bVar3) {
          pAVar4 = TreeDecomposition::getAttribute
                             ((this->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,sVar13);
          Application::typeToStr_abi_cxx11_(&local_3f8,&this->super_Application,pAVar4->_type);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_3f8);
          local_438 = &local_428;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar8) {
            local_428 = *puVar8;
            lStack_420 = plVar5[3];
          }
          else {
            local_428 = *puVar8;
            local_438 = (ulong *)*plVar5;
          }
          local_430 = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_438,(ulong)(pAVar4->_name)._M_dataplus._M_p);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          psVar9 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_418.field_2._M_allocated_capacity = *psVar9;
            local_418.field_2._8_8_ = puVar6[3];
          }
          else {
            local_418.field_2._M_allocated_capacity = *psVar9;
            local_418._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_418._M_string_length = puVar6[1];
          *puVar6 = psVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_418);
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_458.field_2._M_allocated_capacity = *psVar9;
            local_458.field_2._8_8_ = plVar5[3];
            local_458._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_458.field_2._M_allocated_capacity = *psVar9;
            local_458._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_458._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_458._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != paVar2) {
            operator_delete(local_458._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          if (local_438 != &local_428) {
            operator_delete(local_438);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p);
          }
        }
        paVar14 = &local_418.field_2;
        sVar13 = sVar13 + 1;
      } while (sVar13 != 100);
      std::__cxx11::string::pop_back();
      local_3b8 = &local_3a8;
      std::__cxx11::string::_M_construct((ulong)&local_3b8,'\x03');
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      local_3d8 = &local_3c8;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_3c8 = *puVar8;
        lStack_3c0 = plVar5[3];
      }
      else {
        local_3c8 = *puVar8;
        local_3d8 = (ulong *)*plVar5;
      }
      local_3d0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3d8,(ulong)(this_00->_name)._M_dataplus._M_p);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_3f8.field_2._M_allocated_capacity = *psVar9;
        local_3f8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_3f8.field_2._M_allocated_capacity = *psVar9;
        local_3f8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_3f8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_3f8);
      local_438 = &local_428;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_428 = *puVar8;
        lStack_420 = plVar5[3];
      }
      else {
        local_428 = *puVar8;
        local_438 = (ulong *)*plVar5;
      }
      local_430 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_230);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_418.field_2._M_allocated_capacity = *psVar9;
        local_418.field_2._8_8_ = plVar5[3];
        local_418._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_418.field_2._M_allocated_capacity = *psVar9;
        local_418._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_418._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_418);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_458.field_2._M_allocated_capacity = *psVar9;
        local_458.field_2._8_8_ = plVar5[3];
        local_458._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_458.field_2._M_allocated_capacity = *psVar9;
        local_458._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_458._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_458._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar14) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      if (local_438 != &local_428) {
        operator_delete(local_438);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p);
      }
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8);
      }
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct((ulong)local_250,'\x03');
      plVar5 = (long *)std::__cxx11::string::append((char *)local_250);
      local_2f8 = &local_2e8;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_2e8 = *plVar10;
        lStack_2e0 = plVar5[3];
      }
      else {
        local_2e8 = *plVar10;
        local_2f8 = (long *)*plVar5;
      }
      local_2f0 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2f8,(ulong)(this_00->_name)._M_dataplus._M_p);
      local_2d8 = &local_2c8;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_2c8 = *plVar10;
        lStack_2c0 = plVar5[3];
      }
      else {
        local_2c8 = *plVar10;
        local_2d8 = (long *)*plVar5;
      }
      local_2d0 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_2b8 = &local_2a8;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_2a8 = *plVar10;
        lStack_2a0 = plVar5[3];
      }
      else {
        local_2a8 = *plVar10;
        local_2b8 = (long *)*plVar5;
      }
      local_2b0 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_230);
      local_298 = &local_288;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_288 = *plVar10;
        lStack_280 = plVar5[3];
      }
      else {
        local_288 = *plVar10;
        local_298 = (long *)*plVar5;
      }
      local_290 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_398 = &local_388;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_388 = *puVar8;
        lStack_380 = plVar5[3];
      }
      else {
        local_388 = *puVar8;
        local_398 = (ulong *)*plVar5;
      }
      local_390 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_338 = local_328;
      std::__cxx11::string::_M_construct((ulong)&local_338,'\x03');
      uVar12 = 0xf;
      if (local_398 != &local_388) {
        uVar12 = local_388;
      }
      if (uVar12 < (ulong)(local_330 + local_390)) {
        uVar12 = 0xf;
        if (local_338 != local_328) {
          uVar12 = local_328[0];
        }
        if (uVar12 < (ulong)(local_330 + local_390)) goto LAB_0015f6c4;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,(ulong)local_398);
      }
      else {
LAB_0015f6c4:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_398,(ulong)local_338);
      }
      local_3b8 = &local_3a8;
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_3a8 = *puVar1;
        uStack_3a0 = puVar6[3];
      }
      else {
        local_3a8 = *puVar1;
        local_3b8 = (undefined8 *)*puVar6;
      }
      local_3b0 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      local_3d8 = &local_3c8;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_3c8 = *puVar8;
        lStack_3c0 = plVar5[3];
      }
      else {
        local_3c8 = *puVar8;
        local_3d8 = (ulong *)*plVar5;
      }
      local_3d0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_358 = local_348;
      std::__cxx11::string::_M_construct((ulong)&local_358,'\x06');
      uVar12 = 0xf;
      if (local_3d8 != &local_3c8) {
        uVar12 = local_3c8;
      }
      if (uVar12 < (ulong)(local_350 + local_3d0)) {
        uVar12 = 0xf;
        if (local_358 != local_348) {
          uVar12 = local_348[0];
        }
        if (uVar12 < (ulong)(local_350 + local_3d0)) goto LAB_0015f832;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,(ulong)local_3d8);
      }
      else {
LAB_0015f832:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_358);
      }
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_3f8.field_2._M_allocated_capacity = *psVar9;
        local_3f8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_3f8.field_2._M_allocated_capacity = *psVar9;
        local_3f8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_3f8._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)psVar9 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
      local_438 = &local_428;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_428 = *puVar8;
        lStack_420 = puVar6[3];
      }
      else {
        local_428 = *puVar8;
        local_438 = (ulong *)*puVar6;
      }
      local_430 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_378 = local_368;
      std::__cxx11::string::_M_construct((ulong)&local_378,'\x03');
      uVar12 = 0xf;
      if (local_438 != &local_428) {
        uVar12 = local_428;
      }
      if (uVar12 < (ulong)(local_370 + local_430)) {
        uVar12 = 0xf;
        if (local_378 != local_368) {
          uVar12 = local_368[0];
        }
        if (uVar12 < (ulong)(local_370 + local_430)) goto LAB_0015f973;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_438);
      }
      else {
LAB_0015f973:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_378);
      }
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_418.field_2._M_allocated_capacity = *psVar9;
        local_418.field_2._8_8_ = puVar6[3];
        local_418._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_418.field_2._M_allocated_capacity = *psVar9;
        local_418._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_418._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)psVar9 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_418);
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_458.field_2._M_allocated_capacity = *psVar9;
        local_458.field_2._8_8_ = puVar6[3];
        local_458._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_458.field_2._M_allocated_capacity = *psVar9;
        local_458._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_458._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_458._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar14) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      if (local_378 != local_368) {
        operator_delete(local_378);
      }
      if (local_438 != &local_428) {
        operator_delete(local_438);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p);
      }
      if (local_358 != local_348) {
        operator_delete(local_358);
      }
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8);
      }
      if (local_338 != local_328) {
        operator_delete(local_338);
      }
      if (local_398 != &local_388) {
        operator_delete(local_398);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8);
      }
      if (local_250[0] != local_240) {
        operator_delete(local_250[0]);
      }
      sVar13 = local_258;
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
    }
    sVar13 = sVar13 + 1;
    if (sVar13 == 0x5dc) {
      local_458._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_458);
      std::ofstream::ofstream(&local_230,(string *)&local_458,_S_out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"#ifndef INCLUDE_DYNAMICFUNCTIONS_H_\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"#define INCLUDE_DYNAMICFUNCTIONS_H_\n\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"namespace lmfao\n{\n",0x12);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,local_278,local_270);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"}\n\n#endif /* INCLUDE_DYNAMICFUNCTIONS_H_*/\n",0x2b);
      std::ofstream::close();
      local_458._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_458);
      _Var11 = (_Ios_Openmode)&local_458;
      std::ofstream::open((string *)&local_230,_Var11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      std::operator+(&local_418,"#include \"DynamicFunctions.h\"\nnamespace lmfao\n{\n",&local_318);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_418);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_458.field_2._M_allocated_capacity = *psVar9;
        local_458.field_2._8_8_ = plVar5[3];
        local_458._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_458.field_2._M_allocated_capacity = *psVar9;
        local_458._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_458._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      std::ofstream::close();
      local_458._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_458);
      std::ofstream::open((string *)&local_230,_Var11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      dynamicFunctionsGenerator_abi_cxx11_(&local_458,this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      std::ofstream::close();
      local_458._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_458);
      std::ofstream::open((string *)&local_230,_Var11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      dynamicFunctionsGenerator_abi_cxx11_(&local_458,this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,local_458._M_dataplus._M_p,local_458._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != paVar2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      std::ofstream::close();
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p);
      }
      if (local_278 != local_268) {
        operator_delete(local_278);
      }
      return;
    }
  } while( true );
}

Assistant:

void RegressionTree::genDynamicFunctions()
{
    std::string functionHeaders = "";
    std::string functionSource = "";
    for(size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
    {   
        if (_candidateMask[NUM_OF_VARIABLES].test(f))
        {
            Function* func = _compiler->getFunction(f);
            const var_bitset& fVars = func->_fVars;
            std::string fvarString = "";
            
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (fVars.test(var))
                {
                    Attribute* att = _td->getAttribute(var);
                    fvarString += typeToStr(att->_type)+" "+att->_name+",";
                }
            }
            fvarString.pop_back();
            functionHeaders += offset(1)+"double "+func->_name+"("+fvarString+");\n\n";
            functionSource += offset(1)+"double "+func->_name+"("+fvarString+")\n"+
                offset(1)+"{\n"+offset(2)+"return 1.0;\n"+offset(1)+"}\n";
        }
    }
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctions.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_DYNAMICFUNCTIONS_H_\n"<<
        "#define INCLUDE_DYNAMICFUNCTIONS_H_\n\n"<<
        "namespace lmfao\n{\n"<< functionHeaders <<
        "}\n\n#endif /* INCLUDE_DYNAMICFUNCTIONS_H_*/\n";    
    ofs.close();
    
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctions.cpp", std::ofstream::out);
    ofs << "#include \"DynamicFunctions.h\"\nnamespace lmfao\n{\n"+functionSource+"}\n";
    ofs.close();


    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctionsGenerator.hpp", std::ofstream::out);
    ofs << dynamicFunctionsGenerator();
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"RegressionTreeHelper.hpp", std::ofstream::out);
    ofs << dynamicFunctionsGenerator();
    ofs.close();
}